

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QMetaObject::Connection>::clear(QList<QMetaObject::Connection> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QMetaObject::Connection> *this_00;
  __off_t __length;
  QArrayDataPointer<QMetaObject::Connection> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QMetaObject::Connection> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QMetaObject::Connection> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QMetaObject::Connection> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QMetaObject::Connection>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QMetaObject::Connection>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QMetaObject::Connection> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QMetaObject::Connection>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QMetaObject::Connection>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QMetaObject::Connection>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QMetaObject::Connection>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QMetaObject::Connection> *)
                QArrayDataPointer<QMetaObject::Connection>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }